

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool Catch::operator==(ProcessedReporterSpec *lhs,ProcessedReporterSpec *rhs)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(&lhs->name,&rhs->name);
  if (_Var1) {
    _Var1 = std::operator==(&lhs->outputFilename,&rhs->outputFilename);
    if ((_Var1) && (lhs->colourMode == rhs->colourMode)) {
      bVar2 = std::operator==(&(lhs->customOptions)._M_t,&(rhs->customOptions)._M_t);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool operator==( ProcessedReporterSpec const& lhs,
                     ProcessedReporterSpec const& rhs ) {
        return lhs.name == rhs.name &&
               lhs.outputFilename == rhs.outputFilename &&
               lhs.colourMode == rhs.colourMode &&
               lhs.customOptions == rhs.customOptions;
    }